

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O3

void Sim_UtilSimulateNodeOne(Abc_Obj_t *pNode,Vec_Ptr_t *vSimInfo,int nSimWords,int nOffset)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  void **ppvVar7;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  
  uVar1 = *(uint *)&pNode->field_0x14;
  if ((uVar1 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sim/simUtils.c"
                  ,0x133,"void Sim_UtilSimulateNodeOne(Abc_Obj_t *, Vec_Ptr_t *, int, int)");
  }
  iVar2 = pNode->Id;
  if ((-1 < (long)iVar2) && (uVar3 = vSimInfo->nSize, iVar2 < (int)uVar3)) {
    puVar6 = (uint *)(pNode->vFanins).pArray;
    uVar4 = *puVar6;
    if ((-1 < (long)(int)uVar4) && (uVar4 < uVar3)) {
      uVar5 = puVar6[1];
      if ((-1 < (long)(int)uVar5) && (uVar5 < uVar3)) {
        ppvVar7 = vSimInfo->pArray;
        pvVar8 = ppvVar7[iVar2];
        lVar11 = (long)nOffset;
        lVar12 = lVar11 * 4;
        pvVar9 = ppvVar7[(int)uVar4];
        pvVar10 = ppvVar7[(int)uVar5];
        if ((uVar1 >> 0xb & 1) == 0 || (uVar1 >> 10 & 1) == 0) {
          if ((uVar1 >> 10 & 1) == 0 || (uVar1 >> 0xb & 1) != 0) {
            if (((byte)(uVar1 >> 0xb) & (uVar1 >> 10 & 1) == 0) == 0) {
              if (0 < nSimWords) {
                uVar13 = 0;
                do {
                  *(uint *)((long)pvVar8 + uVar13 * 4 + lVar11 * 4) =
                       *(uint *)((long)pvVar10 + uVar13 * 4 + lVar12) &
                       *(uint *)((long)pvVar9 + uVar13 * 4 + lVar12);
                  uVar13 = uVar13 + 1;
                } while ((uint)nSimWords != uVar13);
              }
            }
            else if (0 < nSimWords) {
              uVar13 = 0;
              do {
                *(uint *)((long)pvVar8 + uVar13 * 4 + lVar11 * 4) =
                     ~*(uint *)((long)pvVar10 + uVar13 * 4 + lVar12) &
                     *(uint *)((long)pvVar9 + uVar13 * 4 + lVar12);
                uVar13 = uVar13 + 1;
              } while ((uint)nSimWords != uVar13);
            }
          }
          else if (0 < nSimWords) {
            uVar13 = 0;
            do {
              *(uint *)((long)pvVar8 + uVar13 * 4 + lVar11 * 4) =
                   ~*(uint *)((long)pvVar9 + uVar13 * 4 + lVar12) &
                   *(uint *)((long)pvVar10 + uVar13 * 4 + lVar12);
              uVar13 = uVar13 + 1;
            } while ((uint)nSimWords != uVar13);
          }
        }
        else if (0 < nSimWords) {
          uVar13 = 0;
          do {
            *(uint *)((long)pvVar8 + uVar13 * 4 + lVar11 * 4) =
                 ~(*(uint *)((long)pvVar10 + uVar13 * 4 + lVar12) |
                  *(uint *)((long)pvVar9 + uVar13 * 4 + lVar12));
            uVar13 = uVar13 + 1;
          } while ((uint)nSimWords != uVar13);
        }
        return;
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Sim_UtilSimulateNodeOne( Abc_Obj_t * pNode, Vec_Ptr_t * vSimInfo, int nSimWords, int nOffset )
{
    unsigned * pSimmNode, * pSimmNode1, * pSimmNode2;
    int k, fComp1, fComp2;
    // simulate the internal nodes
    assert( Abc_ObjIsNode(pNode) );
    pSimmNode  = (unsigned *)Vec_PtrEntry(vSimInfo, pNode->Id);
    pSimmNode1 = (unsigned *)Vec_PtrEntry(vSimInfo, Abc_ObjFaninId0(pNode));
    pSimmNode2 = (unsigned *)Vec_PtrEntry(vSimInfo, Abc_ObjFaninId1(pNode));
    pSimmNode  += nOffset;
    pSimmNode1 += nOffset;
    pSimmNode2 += nOffset;
    fComp1 = Abc_ObjFaninC0(pNode);
    fComp2 = Abc_ObjFaninC1(pNode);
    if ( fComp1 && fComp2 )
        for ( k = 0; k < nSimWords; k++ )
            pSimmNode[k] = ~pSimmNode1[k] & ~pSimmNode2[k];
    else if ( fComp1 && !fComp2 )
        for ( k = 0; k < nSimWords; k++ )
            pSimmNode[k] = ~pSimmNode1[k] &  pSimmNode2[k];
    else if ( !fComp1 && fComp2 )
        for ( k = 0; k < nSimWords; k++ )
            pSimmNode[k] =  pSimmNode1[k] & ~pSimmNode2[k];
    else // if ( fComp1 && fComp2 )
        for ( k = 0; k < nSimWords; k++ )
            pSimmNode[k] =  pSimmNode1[k] &  pSimmNode2[k];
}